

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O3

void SN_UpdateActiveSequences(void)

{
  DSeqNode *this;
  
  this = DSeqNode::SequenceListHead;
  if ((DSeqNode::SequenceListHead != (DSeqNode *)0x0 && ActiveSequences != 0) && paused == 0) {
    do {
      DSeqNode::Tick(this);
      this = this->m_Next;
    } while (this != (DSeqNode *)0x0);
  }
  return;
}

Assistant:

void SN_UpdateActiveSequences (void)
{
	DSeqNode *node;

	if (!ActiveSequences || paused)
	{ // No sequences currently playing/game is paused
		return;
	}
	for (node = DSeqNode::FirstSequence(); node; node = node->NextSequence())
	{
		node->Tick ();
	}
}